

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

uint32_t __thiscall CodeGenerator::compute_labels(CodeGenerator *this)

{
  variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *pvVar1;
  bool bVar2;
  uint in_EAX;
  CompiledLabelDef *pCVar3;
  size_t sVar4;
  CompiledData *op;
  variant<CompiledLabelDef,_CompiledCommand,_CompiledHex> *variant;
  uint32_t offset;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  pvVar1 = &((this->compiled).super__Vector_base<CompiledData,_std::allocator<CompiledData>_>.
             _M_impl.super__Vector_impl_data._M_finish)->data;
  for (variant = &((this->compiled).super__Vector_base<CompiledData,_std::allocator<CompiledData>_>.
                   _M_impl.super__Vector_impl_data._M_start)->data; variant != pvVar1;
      variant = variant + 1) {
    bVar2 = is<CompiledLabelDef,eggs::variants::variant<CompiledLabelDef,CompiledCommand,CompiledHex>>
                      (variant);
    if (bVar2) {
      pCVar3 = eggs::variants::
               get<CompiledLabelDef,CompiledLabelDef,CompiledCommand,CompiledHex,0ul>(variant);
      std::experimental::optional<unsigned_int>::operator=
                (&((pCVar3->label).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  code_position,(uint *)((long)&uStack_28 + 4));
    }
    else {
      sVar4 = compiled_size((CompiledData *)variant,this);
      uStack_28 = CONCAT44(uStack_28._4_4_ + (int)sVar4,(undefined4)uStack_28);
    }
  }
  return uStack_28._4_4_;
}

Assistant:

uint32_t CodeGenerator::compute_labels()
{
    uint32_t offset = 0;
    for(auto& op : this->compiled)
    {
        if(is<CompiledLabelDef>(op.data))
        {
            get<CompiledLabelDef>(op.data).label->code_position = offset;
        }
        else
        {
            offset += compiled_size(op, *this);
        }
    }
    return offset;
}